

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O0

void WebRtcNs_AnalyzeCore(NoiseSuppressionC *self,float *speechFrame)

{
  int updateParsFlag_00;
  float fVar1;
  float fVar2;
  float local_12fc;
  ulong local_12f8;
  float local_12ec;
  float local_12e0;
  float local_12c8;
  float local_12c0;
  float local_12b8;
  float local_12b0;
  float use_band;
  float parametric_num;
  float parametric_exp;
  float sum_log_i_log_magn;
  float sum_log_magn;
  float sum_log_i_square;
  float sum_log_i;
  float imag [129];
  float local_1088 [2];
  float real [256];
  float snrLocPrior [129];
  float local_a78 [2];
  float snrLocPost [129];
  float local_868 [2];
  float noise [129];
  float local_658 [2];
  float magn [129];
  float local_448 [2];
  float winData [256];
  float tmpFloat3;
  float tmpFloat2;
  float tmpFloat1;
  float sumMagn;
  float signalEnergy;
  float energy;
  int updateParsFlag;
  size_t kStartBand;
  size_t i;
  float *speechFrame_local;
  NoiseSuppressionC *self_local;
  
  tmpFloat1 = 0.0;
  tmpFloat2 = 0.0;
  sum_log_magn = 0.0;
  sum_log_i_log_magn = 0.0;
  parametric_exp = 0.0;
  parametric_num = 0.0;
  use_band = 0.0;
  local_12b0 = 0.0;
  if (self->initFlag == 1) {
    updateParsFlag_00 = self->modelUpdatePars[0];
    UpdateBuffer(speechFrame,self->blockLen,self->anaLen,self->analyzeBuf);
    Windowing(self->window,self->analyzeBuf,self->anaLen,local_448);
    fVar1 = Energy(local_448,self->anaLen);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      self->blockInd = self->blockInd + 1;
      FFT(self,local_448,self->anaLen,self->magnLen,local_1088,&sum_log_i_square,local_658);
      for (kStartBand = 0; kStartBand < self->magnLen; kStartBand = kStartBand + 1) {
        tmpFloat1 = real[kStartBand - 2] * real[kStartBand - 2] +
                    (&sum_log_i_square)[kStartBand] * (&sum_log_i_square)[kStartBand] + tmpFloat1;
        tmpFloat2 = magn[kStartBand - 2] + tmpFloat2;
        if ((self->blockInd < 0x32) && (4 < kStartBand)) {
          local_12b8 = (float)kStartBand;
          fVar1 = logf(local_12b8);
          sum_log_magn = fVar1 + sum_log_magn;
          sum_log_i_log_magn = fVar1 * fVar1 + sum_log_i_log_magn;
          fVar2 = logf(magn[kStartBand - 2]);
          parametric_exp = fVar2 + parametric_exp;
          parametric_num = fVar1 * fVar2 + parametric_num;
        }
      }
      local_12c0 = (float)self->magnLen;
      self->signalEnergy = tmpFloat1 / local_12c0;
      self->sumMagn = tmpFloat2;
      NoiseEstimation(self,local_658,local_868);
      if (self->blockInd < 0x32) {
        local_12c8 = (float)self->magnLen;
        self->whiteNoiseLevel = (tmpFloat2 / local_12c8) * self->overdrive + self->whiteNoiseLevel;
        local_12e0 = (float)(self->magnLen - 5);
        fVar1 = -sum_log_magn * sum_log_magn + sum_log_i_log_magn * local_12e0;
        winData[0xff] =
             (sum_log_i_log_magn * parametric_exp + -(sum_log_magn * parametric_num)) / fVar1;
        if (winData[0xff] < 0.0) {
          winData[0xff] = 0.0;
        }
        self->pinkNoiseNumerator = self->pinkNoiseNumerator + winData[0xff];
        local_12ec = (float)(self->magnLen - 5);
        winData[0xff] = (-local_12ec * parametric_num + sum_log_magn * parametric_exp) / fVar1;
        if (winData[0xff] < 0.0) {
          winData[0xff] = 0.0;
        }
        if (1.0 < winData[0xff]) {
          winData[0xff] = 1.0;
        }
        self->pinkNoiseExp = winData[0xff] + self->pinkNoiseExp;
        if (0.0 < self->pinkNoiseExp) {
          local_12b0 = expf(self->pinkNoiseNumerator / (float)(self->blockInd + 1));
          local_12b0 = (float)(self->blockInd + 1) * local_12b0;
          use_band = self->pinkNoiseExp / (float)(self->blockInd + 1);
        }
        for (kStartBand = 0; kStartBand < self->magnLen; kStartBand = kStartBand + 1) {
          if ((self->pinkNoiseExp != 0.0) || (NAN(self->pinkNoiseExp))) {
            if (kStartBand < 5) {
              local_12f8 = 5;
            }
            else {
              local_12f8 = kStartBand;
            }
            local_12fc = (float)local_12f8;
            fVar1 = powf(local_12fc,use_band);
            self->parametricNoise[kStartBand] = local_12b0 / fVar1;
          }
          else {
            self->parametricNoise[kStartBand] = self->whiteNoiseLevel;
          }
          noise[kStartBand - 2] = (float)self->blockInd * noise[kStartBand - 2];
          noise[kStartBand - 2] =
               (self->parametricNoise[kStartBand] * (float)(0x32 - self->blockInd)) /
               (float)(self->blockInd + 1) + noise[kStartBand - 2];
          noise[kStartBand - 2] = noise[kStartBand - 2] / 50.0;
        }
      }
      if (self->blockInd < 200) {
        self->featureData[5] = (float)self->blockInd * self->featureData[5];
        self->featureData[5] = tmpFloat1 / local_12c0 + self->featureData[5];
        self->featureData[5] = self->featureData[5] / (float)(self->blockInd + 1);
      }
      ComputeSnr(self,local_658,local_868,real + 0xfe,local_a78);
      FeatureUpdate(self,local_658,updateParsFlag_00);
      SpeechNoiseProb(self,self->speechProb,real + 0xfe,local_a78);
      UpdateNoiseEstimate(self,local_658,real + 0xfe,local_a78,local_868);
      memcpy(self->noise,local_868,self->magnLen << 2);
      memcpy(self->magnPrevAnalyze,local_658,self->magnLen << 2);
    }
    return;
  }
  __assert_fail("self->initFlag == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                ,0x429,"void WebRtcNs_AnalyzeCore(NoiseSuppressionC *, const float *)");
}

Assistant:

void WebRtcNs_AnalyzeCore(NoiseSuppressionC* self, const float* speechFrame) {
  size_t i;
  const size_t kStartBand = 5;  // Skip first frequency bins during estimation.
  int updateParsFlag;
  float energy;
  float signalEnergy = 0.f;
  float sumMagn = 0.f;
  float tmpFloat1, tmpFloat2, tmpFloat3;
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL], noise[HALF_ANAL_BLOCKL];
  float snrLocPost[HALF_ANAL_BLOCKL], snrLocPrior[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];
  // Variables during startup.
  float sum_log_i = 0.0;
  float sum_log_i_square = 0.0;
  float sum_log_magn = 0.0;
  float sum_log_i_log_magn = 0.0;
  float parametric_exp = 0.0;
  float parametric_num = 0.0;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  updateParsFlag = self->modelUpdatePars[0];

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame, self->blockLen, self->anaLen, self->analyzeBuf);

  Windowing(self->window, self->analyzeBuf, self->anaLen, winData);
  energy = Energy(winData, self->anaLen);
  if (energy == 0.0) {
    // We want to avoid updating statistics in this case:
    // Updating feature statistics when we have zeros only will cause
    // thresholds to move towards zero signal situations. This in turn has the
    // effect that once the signal is "turned on" (non-zero values) everything
    // will be treated as speech and there is no noise suppression effect.
    // Depending on the duration of the inactive signal it takes a
    // considerable amount of time for the system to learn what is noise and
    // what is speech.
    return;
  }

  self->blockInd++;  // Update the block index only when we process a block.

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  for (i = 0; i < self->magnLen; i++) {
    signalEnergy += real[i] * real[i] + imag[i] * imag[i];
    sumMagn += magn[i];
    if (self->blockInd < END_STARTUP_SHORT) {
      if (i >= kStartBand) {
        tmpFloat2 = logf((float)i);
        sum_log_i += tmpFloat2;
        sum_log_i_square += tmpFloat2 * tmpFloat2;
        tmpFloat1 = logf(magn[i]);
        sum_log_magn += tmpFloat1;
        sum_log_i_log_magn += tmpFloat2 * tmpFloat1;
      }
    }
  }
  signalEnergy /= self->magnLen;
  self->signalEnergy = signalEnergy;
  self->sumMagn = sumMagn;

  // Quantile noise estimate.
  NoiseEstimation(self, magn, noise);
  // Compute simplified noise model during startup.
  if (self->blockInd < END_STARTUP_SHORT) {
    // Estimate White noise.
    self->whiteNoiseLevel += sumMagn / self->magnLen * self->overdrive;
    // Estimate Pink noise parameters.
    tmpFloat1 = sum_log_i_square * (self->magnLen - kStartBand);
    tmpFloat1 -= (sum_log_i * sum_log_i);
    tmpFloat2 =
        (sum_log_i_square * sum_log_magn - sum_log_i * sum_log_i_log_magn);
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the estimated spectrum to be positive.
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    self->pinkNoiseNumerator += tmpFloat3;
    tmpFloat2 = (sum_log_i * sum_log_magn);
    tmpFloat2 -= (self->magnLen - kStartBand) * sum_log_i_log_magn;
    tmpFloat3 = tmpFloat2 / tmpFloat1;
    // Constrain the pink noise power to be in the interval [0, 1].
    if (tmpFloat3 < 0.f) {
      tmpFloat3 = 0.f;
    }
    if (tmpFloat3 > 1.f) {
      tmpFloat3 = 1.f;
    }
    self->pinkNoiseExp += tmpFloat3;

    // Calculate frequency independent parts of parametric noise estimate.
    if (self->pinkNoiseExp > 0.f) {
      // Use pink noise estimate.
      parametric_num =
          expf(self->pinkNoiseNumerator / (float)(self->blockInd + 1));
      parametric_num *= (float)(self->blockInd + 1);
      parametric_exp = self->pinkNoiseExp / (float)(self->blockInd + 1);
    }
    for (i = 0; i < self->magnLen; i++) {
      // Estimate the background noise using the white and pink noise
      // parameters.
      if (self->pinkNoiseExp == 0.f) {
        // Use white noise estimate.
        self->parametricNoise[i] = self->whiteNoiseLevel;
      } else {
        // Use pink noise estimate.
        float use_band = (float)(i < kStartBand ? kStartBand : i);
        self->parametricNoise[i] =
            parametric_num / powf(use_band, parametric_exp);
      }
      // Weight quantile noise with modeled noise.
      noise[i] *= (self->blockInd);
      tmpFloat2 =
          self->parametricNoise[i] * (END_STARTUP_SHORT - self->blockInd);
      noise[i] += (tmpFloat2 / (float)(self->blockInd + 1));
      noise[i] /= END_STARTUP_SHORT;
    }
  }
  // Compute average signal during END_STARTUP_LONG time:
  // used to normalize spectral difference measure.
  if (self->blockInd < END_STARTUP_LONG) {
    self->featureData[5] *= self->blockInd;
    self->featureData[5] += signalEnergy;
    self->featureData[5] /= (self->blockInd + 1);
  }

  // Post and prior SNR needed for SpeechNoiseProb.
  ComputeSnr(self, magn, noise, snrLocPrior, snrLocPost);

  FeatureUpdate(self, magn, updateParsFlag);
  SpeechNoiseProb(self, self->speechProb, snrLocPrior, snrLocPost);
  UpdateNoiseEstimate(self, magn, snrLocPrior, snrLocPost, noise);

  // Keep track of noise spectrum for next frame.
  memcpy(self->noise, noise, sizeof(*noise) * self->magnLen);
  memcpy(self->magnPrevAnalyze, magn, sizeof(*magn) * self->magnLen);
}